

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O2

void test_qclab_qgates_QGate1<double>(void)

{
  pointer *__ptr;
  char *in_R9;
  char *pcVar1;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  AssertionResult gtest_ar__3;
  V check3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_170;
  V vec3;
  PauliX<double> X;
  V vec1;
  AssertHelper local_118;
  V check2;
  RotationY<double> Y_1;
  V vec2;
  V check1;
  SquareMatrix<double> I1;
  SquareMatrix<double> I2;
  SquareMatrix<double> I3;
  V v3;
  V v2;
  V v1;
  
  qclab::dense::eye<double>((dense *)&I1,2);
  qclab::dense::eye<double>((dense *)&I2,4);
  qclab::dense::eye<double>((dense *)&I3,8);
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&DAT_4008000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>._8_8_ = &DAT_4014000000000000;
  __l._M_len = 2;
  __l._M_array = (iterator)&Y_1;
  std::vector<double,_std::allocator<double>_>::vector(&v1,__l,(allocator_type *)&vec1);
  Y_1.super_QRotationGate1<double>.rotation_.angle_.cos_ = 2.0;
  Y_1.super_QRotationGate1<double>.rotation_.angle_.sin_ = (double)&DAT_401c000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&DAT_4008000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>._8_8_ = &DAT_4014000000000000;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&Y_1;
  std::vector<double,_std::allocator<double>_>::vector(&v2,__l_00,(allocator_type *)&vec1);
  Y_1.super_QRotationGate1<double>.rotation_.angle_.cos_ = 2.0;
  Y_1.super_QRotationGate1<double>.rotation_.angle_.sin_ = (double)&DAT_401c000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&DAT_4008000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>._8_8_ = &DAT_4014000000000000;
  __l_01._M_len = 8;
  __l_01._M_array = (iterator)&Y_1;
  std::vector<double,_std::allocator<double>_>::vector(&v3,__l_01,(allocator_type *)&vec1);
  qclab::qgates::PauliX<double>::PauliX(&X,0);
  std::vector<double,_std::allocator<double>_>::vector(&vec1,&v1);
  qclab::qgates::PauliX<double>::apply(&X,NoTrans,1,&vec1,0);
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&DAT_4014000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>._8_8_ = &DAT_4008000000000000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&Y_1;
  std::vector<double,_std::allocator<double>_>::vector(&check1,__l_02,(allocator_type *)&vec2);
  vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = std::operator==(&vec1,&check1);
  vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  if (!(bool)(char)vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&check2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec2,(AssertionResult *)"vec1 == check1","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vec3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x1d,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vec3,(Message *)&check2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vec3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check2.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     check2.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  std::vector<double,_std::allocator<double>_>::vector(&vec2,&v2);
  qclab::qgates::PauliX<double>::apply(&X,NoTrans,2,&vec2,0);
  Y_1.super_QRotationGate1<double>.rotation_.angle_.cos_ = (double)&DAT_4008000000000000;
  Y_1.super_QRotationGate1<double>.rotation_.angle_.sin_ = (double)&DAT_4014000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&DAT_4000000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>._8_8_ = &DAT_401c000000000000;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&Y_1;
  std::vector<double,_std::allocator<double>_>::vector(&check2,__l_03,(allocator_type *)&vec3);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = std::operator==(&vec2,&check2);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  if (!(bool)(char)vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec3,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x29,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  X.super_QGate1<double>.qubit_ = 1;
  std::vector<double,_std::allocator<double>_>::operator=(&vec2,&v2);
  qclab::qgates::PauliX<double>::apply(&X,NoTrans,2,&vec2,0);
  Y_1.super_QRotationGate1<double>.rotation_.angle_.cos_ = (double)&DAT_401c000000000000;
  Y_1.super_QRotationGate1<double>.rotation_.angle_.sin_ = 2.0;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&DAT_4014000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>._8_8_ = &DAT_4008000000000000;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&check2,&Y_1);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = std::operator==(&vec2,&check2);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  if (!(bool)(char)vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec3,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x35,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  std::vector<double,_std::allocator<double>_>::vector(&vec3,&v3);
  qclab::qgates::PauliX<double>::apply(&X,NoTrans,3,&vec3,0);
  Y_1.super_QRotationGate1<double>.rotation_.angle_.cos_ = (double)&DAT_4008000000000000;
  Y_1.super_QRotationGate1<double>.rotation_.angle_.sin_ = (double)&DAT_4014000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&DAT_4000000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>._8_8_ = &DAT_401c000000000000;
  __l_04._M_len = 8;
  __l_04._M_array = (iterator)&Y_1;
  std::vector<double,_std::allocator<double>_>::vector
            (&check3,__l_04,(allocator_type *)&gtest_ar__3);
  gtest_ar__3.success_ = std::operator==(&vec3,&check3);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message((Message *)&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&gtest_ar__3,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x41,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&Y_1);
    if (local_170._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_170._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  X.super_QGate1<double>._8_8_ = X.super_QGate1<double>._8_8_ & 0xffffffff00000000;
  std::vector<double,_std::allocator<double>_>::operator=(&vec3,&v3);
  qclab::qgates::PauliX<double>::apply(&X,NoTrans,3,&vec3,0);
  Y_1.super_QRotationGate1<double>.rotation_.angle_.cos_ = (double)&DAT_4020000000000000;
  Y_1.super_QRotationGate1<double>.rotation_.angle_.sin_ = (double)&DAT_4008000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&DAT_4010000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_ = 0;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>._12_4_ = 0x3ff00000;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&check3,&Y_1);
  gtest_ar__3.success_ = std::operator==(&vec3,&check3);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message((Message *)&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&gtest_ar__3,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x4d,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&Y_1);
    if (local_170._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_170._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  X.super_QGate1<double>.qubit_ = 2;
  std::vector<double,_std::allocator<double>_>::operator=(&vec3,&v3);
  qclab::qgates::PauliX<double>::apply(&X,NoTrans,3,&vec3,0);
  Y_1.super_QRotationGate1<double>.rotation_.angle_.cos_ = (double)&DAT_401c000000000000;
  Y_1.super_QRotationGate1<double>.rotation_.angle_.sin_ = 2.0;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&DAT_4014000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>._8_8_ = &DAT_4008000000000000;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&check3,&Y_1);
  gtest_ar__3.success_ = std::operator==(&vec3,&check3);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message((Message *)&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&gtest_ar__3,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x59,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&Y_1);
    if (local_170._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_170._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&check3.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vec3.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&check2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vec2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&check1.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vec1.super__Vector_base<double,_std::allocator<double>_>);
  qclab::qgates::RotationY<double>::RotationY((RotationY<double> *)&vec1,0,0.0,1.0,false);
  std::vector<double,_std::allocator<double>_>::vector(&check1,&v1);
  qclab::qgates::RotationY<double>::apply((RotationY<double> *)&vec1,Trans,1,&check1,0);
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&DAT_4014000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_ = 0;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>._12_4_ = 0xc0080000;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&Y_1;
  std::vector<double,_std::allocator<double>_>::vector(&vec2,__l_05,(allocator_type *)&check2);
  check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = std::operator==(&check1,&vec2);
  check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (!(bool)check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&vec3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&check2,(AssertionResult *)"vec1 == check1","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&check3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x6a,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&check3,(Message *)&vec3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&check3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (char)vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(vec3.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)vec3.super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  std::vector<double,_std::allocator<double>_>::vector(&check2,&v2);
  qclab::qgates::RotationY<double>::apply((RotationY<double> *)&vec1,Trans,2,&check2,0);
  Y_1.super_QRotationGate1<double>.rotation_.angle_.cos_ = -3.0;
  Y_1.super_QRotationGate1<double>.rotation_.angle_.sin_ = -5.0;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&DAT_4000000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>._8_8_ = &DAT_401c000000000000;
  __l_06._M_len = 4;
  __l_06._M_array = (iterator)&Y_1;
  std::vector<double,_std::allocator<double>_>::vector(&vec3,__l_06,(allocator_type *)&check3);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = std::operator==(&check2,&vec3);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (!(bool)(char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&check3,(AssertionResult *)"vec2 == check2","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x76,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject._1_7_,
                         (char)X.super_QGate1<double>.super_QObject<double>._vptr_QObject) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject.
                                     _1_7_,(char)X.super_QGate1<double>.super_QObject<double>.
                                                 _vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
  ._0_4_ = 1;
  std::vector<double,_std::allocator<double>_>::operator=(&check2,&v2);
  qclab::qgates::RotationY<double>::apply((RotationY<double> *)&vec1,Trans,2,&check2,0);
  Y_1.super_QRotationGate1<double>.rotation_.angle_.cos_ = (double)&DAT_401c000000000000;
  Y_1.super_QRotationGate1<double>.rotation_.angle_.sin_ = -2.0;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&DAT_4014000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_ = 0;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>._12_4_ = 0xc0080000;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&vec3,&Y_1);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = std::operator==(&check2,&vec3);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (!(bool)(char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&check3,(AssertionResult *)"vec2 == check2","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x82,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject._1_7_,
                         (char)X.super_QGate1<double>.super_QObject<double>._vptr_QObject) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject.
                                     _1_7_,(char)X.super_QGate1<double>.super_QObject<double>.
                                                 _vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  std::vector<double,_std::allocator<double>_>::vector(&check3,&v3);
  qclab::qgates::RotationY<double>::apply((RotationY<double> *)&vec1,Trans,3,&check3,0);
  Y_1.super_QRotationGate1<double>.rotation_.angle_.cos_ = -3.0;
  Y_1.super_QRotationGate1<double>.rotation_.angle_.sin_ = -5.0;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&DAT_4000000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>._8_8_ = &DAT_401c000000000000;
  __l_07._M_len = 8;
  __l_07._M_array = (iterator)&Y_1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&X,__l_07,(allocator_type *)&gtest_ar__3);
  gtest_ar__3.success_ = std::operator==(&check3,(vector<double,_std::allocator<double>_> *)&X);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message((Message *)&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&gtest_ar__3,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x8e,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&Y_1);
    if (local_170._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_170._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
  ._0_4_ = 0;
  std::vector<double,_std::allocator<double>_>::operator=(&check3,&v3);
  qclab::qgates::RotationY<double>::apply((RotationY<double> *)&vec1,Trans,3,&check3,0);
  Y_1.super_QRotationGate1<double>.rotation_.angle_.cos_ = (double)&DAT_4020000000000000;
  Y_1.super_QRotationGate1<double>.rotation_.angle_.sin_ = (double)&DAT_4008000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&DAT_4010000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_ = 0;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>._12_4_ = 0x3ff00000;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&X,&Y_1);
  gtest_ar__3.success_ = std::operator==(&check3,(vector<double,_std::allocator<double>_> *)&X);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message((Message *)&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&gtest_ar__3,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x9a,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&Y_1);
    if (local_170._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_170._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
  ._0_4_ = 2;
  std::vector<double,_std::allocator<double>_>::operator=(&check3,&v3);
  qclab::qgates::RotationY<double>::apply((RotationY<double> *)&vec1,Trans,3,&check3,0);
  Y_1.super_QRotationGate1<double>.rotation_.angle_.cos_ = (double)&DAT_401c000000000000;
  Y_1.super_QRotationGate1<double>.rotation_.angle_.sin_ = -2.0;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&DAT_4014000000000000;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_ = 0;
  Y_1.super_QRotationGate1<double>.super_QGate1<double>._12_4_ = 0xc0080000;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&X,&Y_1);
  gtest_ar__3.success_ = std::operator==(&check3,(vector<double,_std::allocator<double>_> *)&X);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message((Message *)&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&gtest_ar__3,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xa6,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&Y_1);
    if (local_170._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_170._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&X);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&check3.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vec3.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&check2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vec2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&check1.super__Vector_base<double,_std::allocator<double>_>);
  qclab::qgates::PauliX<double>::PauliX((PauliX<double> *)&vec1,0);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&check1,&I1);
  pcVar1 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&vec1,Left,NoTrans,1,(SquareMatrix<double> *)&check1,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&Y_1);
  vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = qclab::dense::SquareMatrix<double>::operator==
                    ((SquareMatrix<double> *)&check1,(SquareMatrix<double> *)&Y_1);
  vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_);
  if ((char)vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start == '\0') {
    testing::Message::Message((Message *)&check2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec2,(AssertionResult *)"mat1 == X.matrix()","false",
               "true",pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vec3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xb7,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vec3,(Message *)&check2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vec3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check2.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     check2.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&Y_1,2.0,3.0,5.0,7.0);
  qclab::dense::SquareMatrix<double>::operator=
            ((SquareMatrix<double> *)&check1,(SquareMatrix<double> *)&Y_1);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_);
  pcVar1 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&vec1,Left,NoTrans,1,(SquareMatrix<double> *)&check1,0);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&vec2,3.0,2.0,7.0,5.0);
  check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       qclab::dense::SquareMatrix<double>::operator==
                 ((SquareMatrix<double> *)&check1,(SquareMatrix<double> *)&vec2);
  check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (!(bool)check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&vec3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&check2,(AssertionResult *)"mat1 == check1","false","true"
               ,pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&check3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xbd,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&check3,(Message *)&vec3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&check3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (char)vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(vec3.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)vec3.super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&check2,&I2);
  pcVar1 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&vec1,Left,NoTrans,2,(SquareMatrix<double> *)&check2,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&check3);
  qclab::dense::kron<double>((dense *)&Y_1,(SquareMatrix<double> *)&check3,&I1);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = qclab::dense::SquareMatrix<double>::operator==
                    ((SquareMatrix<double> *)&check2,(SquareMatrix<double> *)&Y_1);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  if ((char)vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start == '\0') {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec3,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xc2,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
  ._0_4_ = 1;
  qclab::dense::SquareMatrix<double>::operator=((SquareMatrix<double> *)&check2,&I2);
  pcVar1 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&vec1,Left,NoTrans,2,(SquareMatrix<double> *)&check2,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&check3);
  qclab::dense::kron<double>((dense *)&Y_1,&I1,(SquareMatrix<double> *)&check3);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = qclab::dense::SquareMatrix<double>::operator==
                    ((SquareMatrix<double> *)&check2,(SquareMatrix<double> *)&Y_1);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  if ((char)vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start == '\0') {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec3,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,199,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                            super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&vec3,&I3);
  pcVar1 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&vec1,Left,NoTrans,3,(SquareMatrix<double> *)&vec3,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&gtest_ar__3);
  qclab::dense::kron<double>((dense *)&X,(SquareMatrix<double> *)&gtest_ar__3,&I1);
  qclab::dense::kron<double>((dense *)&Y_1,&I1,(SquareMatrix<double> *)&X);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       qclab::dense::SquareMatrix<double>::operator==
                 ((SquareMatrix<double> *)&vec3,(SquareMatrix<double> *)&Y_1);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&X.super_QGate1<double>.qubit_)
  ;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar__3.message_);
  if ((char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&check3,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xcd,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject._1_7_,
                         (char)X.super_QGate1<double>.super_QObject<double>._vptr_QObject) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject.
                                     _1_7_,(char)X.super_QGate1<double>.super_QObject<double>.
                                                 _vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &check1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  qclab::qgates::PauliX<double>::PauliX((PauliX<double> *)&vec1,0);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&check1,&I1);
  pcVar1 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&vec1,Right,NoTrans,1,(SquareMatrix<double> *)&check1,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&Y_1);
  vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = qclab::dense::SquareMatrix<double>::operator==
                    ((SquareMatrix<double> *)&check1,(SquareMatrix<double> *)&Y_1);
  vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_);
  if ((char)vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start == '\0') {
    testing::Message::Message((Message *)&check2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec2,(AssertionResult *)"mat1 == X.matrix()","false",
               "true",pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vec3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xd7,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vec3,(Message *)&check2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vec3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check2.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     check2.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&Y_1,2.0,3.0,5.0,7.0);
  qclab::dense::SquareMatrix<double>::operator=
            ((SquareMatrix<double> *)&check1,(SquareMatrix<double> *)&Y_1);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_);
  pcVar1 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&vec1,Right,NoTrans,1,(SquareMatrix<double> *)&check1,0);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&vec2,5.0,7.0,2.0,3.0);
  check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       qclab::dense::SquareMatrix<double>::operator==
                 ((SquareMatrix<double> *)&check1,(SquareMatrix<double> *)&vec2);
  check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (!(bool)check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&vec3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&check2,(AssertionResult *)"mat1 == check1","false","true"
               ,pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&check3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xdd,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&check3,(Message *)&vec3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&check3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (char)vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(vec3.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)vec3.super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&check2,&I2);
  pcVar1 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&vec1,Right,NoTrans,2,(SquareMatrix<double> *)&check2,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&check3);
  qclab::dense::kron<double>((dense *)&Y_1,(SquareMatrix<double> *)&check3,&I1);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = qclab::dense::SquareMatrix<double>::operator==
                    ((SquareMatrix<double> *)&check2,(SquareMatrix<double> *)&Y_1);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  if ((char)vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start == '\0') {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec3,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe2,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
  ._0_4_ = 1;
  qclab::dense::SquareMatrix<double>::operator=((SquareMatrix<double> *)&check2,&I2);
  pcVar1 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&vec1,Right,NoTrans,2,(SquareMatrix<double> *)&check2,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&check3);
  qclab::dense::kron<double>((dense *)&Y_1,&I1,(SquareMatrix<double> *)&check3);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = qclab::dense::SquareMatrix<double>::operator==
                    ((SquareMatrix<double> *)&check2,(SquareMatrix<double> *)&Y_1);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  if ((char)vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start == '\0') {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec3,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe7,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&vec3,&I3);
  pcVar1 = (char *)0x0;
  qclab::qgates::PauliX<double>::apply
            ((PauliX<double> *)&vec1,Right,NoTrans,3,(SquareMatrix<double> *)&vec3,0);
  qclab::qgates::PauliX<double>::matrix((PauliX<double> *)&gtest_ar__3);
  qclab::dense::kron<double>((dense *)&X,(SquareMatrix<double> *)&gtest_ar__3,&I1);
  qclab::dense::kron<double>((dense *)&Y_1,&I1,(SquareMatrix<double> *)&X);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       qclab::dense::SquareMatrix<double>::operator==
                 ((SquareMatrix<double> *)&vec3,(SquareMatrix<double> *)&Y_1);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&X.super_QGate1<double>.qubit_)
  ;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar__3.message_);
  if ((char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&check3,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xed,(char *)Y_1.super_QRotationGate1<double>.super_QGate1<double>.
                             super_QObject<double>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject._1_7_,
                         (char)X.super_QGate1<double>.super_QObject<double>._vptr_QObject) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject.
                                     _1_7_,(char)X.super_QGate1<double>.super_QObject<double>.
                                                 _vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &check1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  qclab::qgates::RotationY<double>::RotationY(&Y_1,0,0.0,1.0,false);
  qclab::qgates::RotationY<double>::matrix((RotationY<double> *)&vec1);
  qclab::dense::trans<qclab::dense::SquareMatrix<double>>
            ((dense *)&check1,(SquareMatrix<double> *)&vec1);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&vec2,&I1);
  pcVar1 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply(&Y_1,Left,Trans,1,(SquareMatrix<double> *)&vec2,0);
  check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       qclab::dense::SquareMatrix<double>::operator==
                 ((SquareMatrix<double> *)&vec2,(SquareMatrix<double> *)&check1);
  check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (!(bool)check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&vec3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&check2,(AssertionResult *)"mat1 == Ytrans","false",
               "true",pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&check3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xf8,(char *)vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&check3,(Message *)&vec3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&check3);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (char)vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(vec3.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)vec3.super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&vec1,2.0,3.0,5.0,7.0);
  qclab::dense::SquareMatrix<double>::operator=
            ((SquareMatrix<double> *)&vec2,(SquareMatrix<double> *)&vec1);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  pcVar1 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply(&Y_1,Left,Trans,1,(SquareMatrix<double> *)&vec2,0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&check2,-3.0,2.0,-7.0,5.0);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = qclab::dense::SquareMatrix<double>::operator==
                    ((SquareMatrix<double> *)&vec2,(SquareMatrix<double> *)&check2);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  if (!(bool)(char)vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&vec3,(AssertionResult *)"mat1 == check1","false","true",
               pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xfe,(char *)vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&vec3,&I2);
  pcVar1 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply(&Y_1,Left,Trans,2,(SquareMatrix<double> *)&vec3,0);
  qclab::dense::kron<double>((dense *)&vec1,(SquareMatrix<double> *)&check1,&I1);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       qclab::dense::SquareMatrix<double>::operator==
                 ((SquareMatrix<double> *)&vec3,(SquareMatrix<double> *)&vec1);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  if ((char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&check3,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar1)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x103,(char *)vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject._1_7_,
                         (char)X.super_QGate1<double>.super_QObject<double>._vptr_QObject) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject.
                                     _1_7_,(char)X.super_QGate1<double>.super_QObject<double>.
                                                 _vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_ = 1;
  qclab::dense::SquareMatrix<double>::operator=((SquareMatrix<double> *)&vec3,&I2);
  pcVar1 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply(&Y_1,Left,Trans,2,(SquareMatrix<double> *)&vec3,0);
  qclab::dense::kron<double>((dense *)&vec1,&I1,(SquareMatrix<double> *)&check1);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       qclab::dense::SquareMatrix<double>::operator==
                 ((SquareMatrix<double> *)&vec3,(SquareMatrix<double> *)&vec1);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  if ((char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&check3,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar1)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x108,(char *)vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject._1_7_,
                         (char)X.super_QGate1<double>.super_QObject<double>._vptr_QObject) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject.
                                     _1_7_,(char)X.super_QGate1<double>.super_QObject<double>.
                                                 _vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&check3,&I3);
  pcVar1 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply(&Y_1,Left,Trans,3,(SquareMatrix<double> *)&check3,0);
  qclab::dense::kron<double>((dense *)&gtest_ar__3,(SquareMatrix<double> *)&check1,&I1);
  qclab::dense::kron<double>((dense *)&vec1,&I1,(SquareMatrix<double> *)&gtest_ar__3);
  X.super_QGate1<double>.super_QObject<double>._vptr_QObject._0_1_ =
       qclab::dense::SquareMatrix<double>::operator==
                 ((SquareMatrix<double> *)&check3,(SquareMatrix<double> *)&vec1);
  X.super_QGate1<double>.qubit_ = 0;
  X.super_QGate1<double>._12_4_ = 0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar__3.message_);
  if ((char)X.super_QGate1<double>.super_QObject<double>._vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&X,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x10e,(char *)vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&X.super_QGate1<double>.qubit_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &check1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  qclab::qgates::RotationY<double>::RotationY(&Y_1,0,0.0,1.0,false);
  qclab::qgates::RotationY<double>::matrix((RotationY<double> *)&vec1);
  qclab::dense::trans<qclab::dense::SquareMatrix<double>>
            ((dense *)&check1,(SquareMatrix<double> *)&vec1);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&vec2,&I1);
  pcVar1 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply(&Y_1,Right,Trans,1,(SquareMatrix<double> *)&vec2,0);
  check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       qclab::dense::SquareMatrix<double>::operator==
                 ((SquareMatrix<double> *)&vec2,(SquareMatrix<double> *)&check1);
  check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (!(bool)check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&vec3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&check2,(AssertionResult *)"mat1 == Ytrans","false",
               "true",pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&check3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x119,(char *)vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&check3,(Message *)&vec3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&check3);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (char)vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(vec3.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)vec3.super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&vec1,2.0,3.0,5.0,7.0);
  qclab::dense::SquareMatrix<double>::operator=
            ((SquareMatrix<double> *)&vec2,(SquareMatrix<double> *)&vec1);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  pcVar1 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply(&Y_1,Right,Trans,1,(SquareMatrix<double> *)&vec2,0);
  qclab::dense::SquareMatrix<double>::SquareMatrix
            ((SquareMatrix<double> *)&check2,5.0,7.0,-2.0,-3.0);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = qclab::dense::SquareMatrix<double>::operator==
                    ((SquareMatrix<double> *)&vec2,(SquareMatrix<double> *)&check2);
  vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  if (!(bool)(char)vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&vec3,(AssertionResult *)"mat1 == check1","false","true",
               pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x11f,(char *)vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&vec3,&I2);
  pcVar1 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply(&Y_1,Right,Trans,2,(SquareMatrix<double> *)&vec3,0);
  qclab::dense::kron<double>((dense *)&vec1,(SquareMatrix<double> *)&check1,&I1);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       qclab::dense::SquareMatrix<double>::operator==
                 ((SquareMatrix<double> *)&vec3,(SquareMatrix<double> *)&vec1);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  if ((char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&check3,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar1)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x124,(char *)vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject._1_7_,
                         (char)X.super_QGate1<double>.super_QObject<double>._vptr_QObject) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject.
                                     _1_7_,(char)X.super_QGate1<double>.super_QObject<double>.
                                                 _vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  Y_1.super_QRotationGate1<double>.super_QGate1<double>.qubit_ = 1;
  qclab::dense::SquareMatrix<double>::operator=((SquareMatrix<double> *)&vec3,&I2);
  pcVar1 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply(&Y_1,Right,Trans,2,(SquareMatrix<double> *)&vec3,0);
  qclab::dense::kron<double>((dense *)&vec1,&I1,(SquareMatrix<double> *)&check1);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ =
       qclab::dense::SquareMatrix<double>::operator==
                 ((SquareMatrix<double> *)&vec3,(SquareMatrix<double> *)&vec1);
  check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  if ((char)check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&check3,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar1)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x129,(char *)vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject._1_7_,
                         (char)X.super_QGate1<double>.super_QObject<double>._vptr_QObject) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<double>.super_QObject<double>._vptr_QObject.
                                     _1_7_,(char)X.super_QGate1<double>.super_QObject<double>.
                                                 _vptr_QObject) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)&check3,&I3);
  pcVar1 = (char *)0x0;
  qclab::qgates::RotationY<double>::apply(&Y_1,Right,Trans,3,(SquareMatrix<double> *)&check3,0);
  qclab::dense::kron<double>((dense *)&gtest_ar__3,(SquareMatrix<double> *)&check1,&I1);
  qclab::dense::kron<double>((dense *)&vec1,&I1,(SquareMatrix<double> *)&gtest_ar__3);
  X.super_QGate1<double>.super_QObject<double>._vptr_QObject._0_1_ =
       qclab::dense::SquareMatrix<double>::operator==
                 ((SquareMatrix<double> *)&check3,(SquareMatrix<double> *)&vec1);
  X.super_QGate1<double>.qubit_ = 0;
  X.super_QGate1<double>._12_4_ = 0;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar__3.message_);
  if ((char)X.super_QGate1<double>.super_QObject<double>._vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&X,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,pcVar1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x12f,(char *)vec1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&X.super_QGate1<double>.qubit_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &check3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &check2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)
             &check1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v3.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v1.super__Vector_base<double,_std::allocator<double>_>);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&I3.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&I2.data_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&I1.data_);
  return;
}

Assistant:

void test_qclab_qgates_QGate1() {

  using R = qclab::real_t< T > ;
  using V = std::vector< T > ;
  using M = qclab::dense::SquareMatrix< T > ;

  const auto I1 = qclab::dense::eye< T >( 2 ) ;
  const auto I2 = qclab::dense::eye< T >( 4 ) ;
  const auto I3 = qclab::dense::eye< T >( 8 ) ;

  const V v1 = { 3 , 5 } ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;

  // apply (NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    X.apply( qclab::Op::NoTrans , 1 , vec1 ) ;
    V check1 = { 5 , 3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { X.apply_device( qclab::Op::NoTrans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , 3 , 5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    X.setQubit( 1 ) ;
    vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    check2 = { 5 , 3 , 7 , 2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , 3 , 5 , 8 , 3 , 4 , 1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 0 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , 3 , 5 , 2 , 7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 2 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 5 , 3 , 7 , 2 , 1 , 4 , 3 , 8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }

  // apply (Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    Y.apply( qclab::Op::Trans , 1 , vec1 ) ;
    V check1 = { 5 , -3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { Y.apply_device( qclab::Op::Trans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , -3 , -5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    Y.setQubit( 1 ) ;
    vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    check2 = { 5 , -3 , 7 , -2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , -3 , -5 , 8 , 3 , -4 , -1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 0 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , -3 , -5 , -2 , -7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 2 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 5 , -3 , 7 , -2 , 1 , -4 , 3 , -8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }


  // apply (Left + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 3 , 2 ,
              7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Right + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 5 , 7 ,
              2 , 3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Left + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    M check1( -3 , 2 ,
              -7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

  // apply (Right + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    M check1(  5 ,  7 ,
              -2 , -3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

}